

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnetcfg.cpp
# Opt level: O2

void vmnet_check_storagesrv_stat(char *stat)

{
  int iVar1;
  
  iVar1 = bcmp(stat,"OK ",3);
  if (iVar1 != 0) {
    CVmRun::push_string(&G_interpreter_X,stat);
    free(stat);
    CVmRun::throw_new_rtesub(&G_interpreter_X,G_predef_X.storage_server_error,1,0x4b9);
    return;
  }
  free(stat);
  return;
}

Assistant:

void vmnet_check_storagesrv_stat(VMG_ char *stat)
{
    /* if it's not "OK", throw an error */
    if (memcmp(stat, "OK ", 3) != 0)
    {
        /* 
         *   Error.  Push the error code/message text string as the argument
         *   to the runtime error constructor, then discard our copy of the
         *   buffer.  
         */
        G_interpreter->push_string(vmg_ stat);
        t3free(stat);

        /* throw a StorageServerError */
        G_interpreter->throw_new_rtesub(
            vmg_ G_predef->storage_server_error, 1,
            VMERR_STORAGE_SERVER_ERR);
    }
    else
    {
        /* success - discard the message text */
        t3free(stat);
    }
}